

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

ScalarFunction *
duckdb::SubtractFunction::GetFunction(ScalarFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType varargs;
  BaseScalarFunction *this;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb4;
  FunctionNullHandling FVar1;
  bind_lambda_function_t in_stack_fffffffffffffcc8;
  LogicalType local_330;
  scalar_function_t local_318;
  _Any_data local_2f8;
  code *local_2e8;
  undefined8 uStack_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  LogicalType local_2b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2a0;
  LogicalType local_288;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_270;
  LogicalType local_258;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_240;
  string local_228;
  string local_208;
  string local_1e8;
  LogicalType local_1c8;
  LogicalType local_1b0;
  LogicalType local_198;
  BaseScalarFunction local_180;
  BaseScalarFunction local_d0;
  
  if (type->id_ == DECIMAL) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"-","");
    LogicalType::LogicalType(&local_330,type);
    __l_00._M_len = 1;
    __l_00._M_array = &local_330;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_270,__l_00,(allocator_type *)&stack0xfffffffffffffccf);
    LogicalType::LogicalType(&local_288,type);
    local_2e8 = (code *)0x0;
    uStack_2e0 = 0;
    local_2f8._M_unused._M_object = (void *)0x0;
    local_2f8._8_8_ = 0;
    FVar1 = 0x14;
    LogicalType::LogicalType(&local_1b0,INVALID);
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_208,(vector<duckdb::LogicalType,_true> *)&local_270,
               &local_288,(scalar_function_t *)&local_2f8,DecimalNegateBind,
               (bind_scalar_function_extended_t)0x0,NegateBindStatistics,(init_local_state_t)0x0,
               (LogicalType)ZEXT824(&local_1b0),CONSISTENT,FVar1,in_stack_fffffffffffffcc8);
    LogicalType::~LogicalType(&local_1b0);
    if (local_2e8 != (code *)0x0) {
      (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
    }
    LogicalType::~LogicalType(&local_288);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_270);
    LogicalType::~LogicalType(&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
  }
  else {
    if (type->id_ == INTERVAL) {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"-","");
      LogicalType::LogicalType(&local_330,type);
      __l._M_len = 1;
      __l._M_array = &local_330;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_240,__l,(allocator_type *)&stack0xfffffffffffffccf);
      LogicalType::LogicalType(&local_258,type);
      local_318.super__Function_base._M_functor._8_8_ = 0;
      local_318.super__Function_base._M_functor._M_unused._M_function_pointer =
           ScalarFunction::
           UnaryFunction<duckdb::interval_t,duckdb::interval_t,duckdb::NegateOperator>;
      local_318._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_318.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      FVar1 = 0xc9;
      LogicalType::LogicalType(&local_198,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_198;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffcac;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffcb4;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_1e8,(vector<duckdb::LogicalType,_true> *)&local_240,
                 &local_258,&local_318,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,FVar1,in_stack_fffffffffffffcc8);
      LogicalType::~LogicalType(&local_198);
      if (local_318.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_318.super__Function_base._M_manager)
                  ((_Any_data *)&local_318,(_Any_data *)&local_318,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_258);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_240);
      LogicalType::~LogicalType(&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_d0,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_d0;
    }
    else {
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"-","");
      LogicalType::LogicalType(&local_330,type);
      __l_01._M_len = 1;
      __l_01._M_array = &local_330;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2a0,__l_01,(allocator_type *)&stack0xfffffffffffffccf);
      LogicalType::LogicalType(&local_2b8,type);
      ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>
                ((scalar_function_t *)&local_2d8,type);
      FVar1 = 0x43;
      LogicalType::LogicalType(&local_1c8,INVALID);
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_228,(vector<duckdb::LogicalType,_true> *)&local_2a0,
                 &local_2b8,(scalar_function_t *)&local_2d8,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,NegateBindStatistics,(init_local_state_t)0x0,
                 (LogicalType)ZEXT824(&local_1c8),CONSISTENT,FVar1,in_stack_fffffffffffffcc8);
      LogicalType::~LogicalType(&local_1c8);
      if (local_2c8 != (code *)0x0) {
        (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_2b8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2a0);
      LogicalType::~LogicalType(&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_180,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_180;
    }
    BaseScalarFunction::~BaseScalarFunction(this);
  }
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction SubtractFunction::GetFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::INTERVAL) {
		ScalarFunction func("-", {type}, type, ScalarFunction::UnaryFunction<interval_t, interval_t, NegateOperator>);
		ScalarFunction::SetReturnsError(func);
		return func;
	} else if (type.id() == LogicalTypeId::DECIMAL) {
		ScalarFunction func("-", {type}, type, nullptr, DecimalNegateBind, nullptr, NegateBindStatistics);
		return func;
	} else {
		D_ASSERT(type.IsNumeric());
		ScalarFunction func("-", {type}, type, ScalarFunction::GetScalarUnaryFunction<NegateOperator>(type), nullptr,
		                    nullptr, NegateBindStatistics);
		ScalarFunction::SetReturnsError(func);
		return func;
	}
}